

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,IO *this,istream *is,
          unsigned_long num_entries)

{
  pointer piVar1;
  vector<int,_std::allocator<int>_> *__range3;
  int *i;
  pointer piVar2;
  allocator_type local_21;
  
  ::std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,(size_type)is,&local_21);
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    ::std::istream::operator>>((istream *)this,piVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VecType> readVector(std::istream &is, SizeType num_entries){
    std::vector<VecType> x((size_t) num_entries);
    readVector<iomode, VecType>(is, x);
    return x;
}